

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O3

bool __thiscall wasm::WasmSplitOptions::validate(WasmSplitOptions *this)

{
  pointer pbVar1;
  const_iterator cVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  pointer __k;
  bool bVar6;
  bool bVar7;
  stringstream local_1d8 [8];
  stringstream msg;
  ostream local_1c8 [112];
  ios_base local_158 [264];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  bVar6 = (this->inputFiles).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->inputFiles).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"no input file",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  }
  if (this->mode < MergeProfiles) {
    if ((ulong)((long)(this->inputFiles).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->inputFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_00116e61;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
    pcVar5 = "Cannot have more than one input file.";
    lVar4 = 0x25;
  }
  else {
    if ((this->mode != PrintProfile) ||
       ((long)(this->inputFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->inputFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20)) goto LAB_00116e61;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
    pcVar5 = "Must have exactly one profile path.";
    lVar4 = 0x23;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  bVar6 = false;
LAB_00116e61:
  pbVar1 = (this->usedOptions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (this->usedOptions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar1; __k = __k + 1) {
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->validOptions)._M_elems[this->mode]._M_h,__k);
    if (cVar2.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::stringstream::stringstream(local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1c8,"Option ",7);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1c8,(__k->_M_dataplus)._M_p,__k->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," cannot be used in ",0x13);
      anon_unknown_12::operator<<(poVar3,(Mode *)(ulong)this->mode);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," mode.",6);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1d8);
      std::ios_base::~ios_base(local_158);
      bVar6 = false;
    }
  }
  if (this->mode == Split) {
    if ((this->profileFile)._M_string_length != 0) {
      if ((this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        bVar7 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Cannot use both --profile and --keep-funcs.",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        bVar7 = (this->profileFile)._M_string_length == 0;
        bVar6 = false;
      }
      if ((!bVar7) && ((this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Cannot use both --profile and --split-funcs.",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
        bVar6 = false;
      }
    }
    if (((this->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       ((this->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot use both --keep-funcs and --split-funcs.",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool WasmSplitOptions::validate() {
  bool valid = true;
  auto fail = [&](auto msg) {
    std::cerr << "error: " << msg << "\n";
    valid = false;
  };

  // Validate the positional arguments.
  if (inputFiles.size() == 0) {
    fail("no input file");
  }
  switch (mode) {
    case Mode::Split:
    case Mode::Instrument:
      if (inputFiles.size() > 1) {
        fail("Cannot have more than one input file.");
      }
      break;
    case Mode::MergeProfiles:
      // Any number >= 1 allowed.
      break;
    case Mode::PrintProfile:
      if (inputFiles.size() != 1) {
        fail("Must have exactly one profile path.");
      }
      break;
  }

  // Validate that all used options are allowed in the current mode.
  for (std::string& opt : usedOptions) {
    if (!validOptions[static_cast<unsigned>(mode)].count(opt)) {
      std::stringstream msg;
      msg << "Option " << opt << " cannot be used in " << mode << " mode.";
      fail(msg.str());
    }
  }

  if (mode == Mode::Split) {
    if (profileFile.size() && keepFuncs.size()) {
      fail("Cannot use both --profile and --keep-funcs.");
    }
    if (profileFile.size() && splitFuncs.size()) {
      fail("Cannot use both --profile and --split-funcs.");
    }
    if (keepFuncs.size() && splitFuncs.size()) {
      fail("Cannot use both --keep-funcs and --split-funcs.");
    }
  }

  return valid;
}